

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_test.cc
# Opt level: O0

void __thiscall sample_after_nomalizing_basic::test_method(sample_after_nomalizing_basic *this)

{
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> pdf_last;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> pdf_last_00;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> pdf_last_01;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> pdf_last_02;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> pdf_last_03;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  bool bVar1;
  iterator lhs;
  iterator rhs;
  int scode;
  uint32_t chosen_index;
  vector<float,_std::allocator<float>_> expected;
  vector<float,_std::allocator<float>_> pdf;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffbf8;
  char *pcVar2;
  basic_cstring<const_char> *in_stack_fffffffffffffc00;
  lazy_ostream *in_stack_fffffffffffffc08;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffc10;
  undefined7 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_fffffffffffffc20;
  allocator_type *in_stack_fffffffffffffc28;
  undefined8 uVar3;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  iterator in_stack_fffffffffffffc38;
  size_type in_stack_fffffffffffffc40;
  undefined1 local_2e4 [20];
  undefined1 local_2d0 [40];
  undefined1 local_2a8 [16];
  undefined1 local_298 [12];
  float in_stack_fffffffffffffd74;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffd78;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffd80;
  undefined1 local_274 [20];
  undefined1 local_260 [40];
  undefined1 local_238 [16];
  basic_cstring<const_char> local_228;
  float *local_218;
  float *local_210;
  undefined1 local_204 [20];
  undefined1 local_1f0 [40];
  undefined1 local_1c8 [16];
  basic_cstring<const_char> local_1b8;
  float *local_1a8;
  float *local_1a0;
  undefined1 local_194 [20];
  undefined1 local_180 [40];
  undefined1 local_158 [16];
  basic_cstring<const_char> local_148;
  float *local_138;
  float *local_130;
  undefined1 local_124 [20];
  undefined1 local_110 [40];
  undefined1 local_e8 [16];
  basic_cstring<const_char> local_d8;
  float *local_c8;
  float *local_c0;
  int local_b4 [3];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined8 *local_88;
  undefined8 local_80;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined8 *local_30;
  undefined8 local_28;
  
  local_48 = 0x400000003f800000;
  uStack_40 = 0x4080000040400000;
  local_38 = 0x40a00000;
  local_30 = &local_48;
  local_28 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x14882a);
  __l._M_len = in_stack_fffffffffffffc40;
  __l._M_array = in_stack_fffffffffffffc38;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),__l,
             in_stack_fffffffffffffc28);
  std::allocator<float>::~allocator((allocator<float> *)0x14885e);
  local_a8 = 0x3e0888893d888889;
  uStack_a0 = 0x3e8888893e4ccccd;
  local_98 = 0x3eaaaaab;
  local_88 = &local_a8;
  local_80 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x1488a9);
  __l_00._M_len = in_stack_fffffffffffffc40;
  __l_00._M_array = in_stack_fffffffffffffc38;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),__l_00,
             in_stack_fffffffffffffc28);
  std::allocator<float>::~allocator((allocator<float> *)0x1488dd);
  local_c0 = (float *)std::begin<std::vector<float,std::allocator<float>>>
                                (in_stack_fffffffffffffbf8);
  local_c8 = (float *)std::end<std::vector<float,std::allocator<float>>>(in_stack_fffffffffffffbf8);
  pdf_last._M_current._7_1_ = in_stack_fffffffffffffc1f;
  pdf_last._M_current._0_7_ = in_stack_fffffffffffffc18;
  local_b4[0] = exploration::
                sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                          ((uint64_t)in_stack_fffffffffffffc10,in_stack_fffffffffffffc20,pdf_last,
                           (uint32_t *)in_stack_fffffffffffffc08);
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffc00);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,&local_d8,0x13,local_e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc08,(char (*) [1])in_stack_fffffffffffffc00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_124 + 4),
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
               ,0x6d);
    local_124._0_4_ = 0;
    in_stack_fffffffffffffc08 = (lazy_ostream *)0x417703;
    in_stack_fffffffffffffc00 = (basic_cstring<const_char> *)local_124;
    pcVar2 = "scode";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_110,local_124 + 4,0x13,1,2,local_b4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x148a74);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  check_float_vectors(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd74)
  ;
  local_130 = (float *)std::begin<std::vector<float,std::allocator<float>>>
                                 ((vector<float,_std::allocator<float>_> *)pcVar2);
  local_138 = (float *)std::end<std::vector<float,std::allocator<float>>>
                                 ((vector<float,_std::allocator<float>_> *)pcVar2);
  pdf_last_00._M_current._7_1_ = in_stack_fffffffffffffc1f;
  pdf_last_00._M_current._0_7_ = in_stack_fffffffffffffc18;
  local_b4[0] = exploration::
                sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                          ((uint64_t)in_stack_fffffffffffffc10,in_stack_fffffffffffffc20,pdf_last_00
                           ,(uint32_t *)in_stack_fffffffffffffc08);
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffc00);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,&local_148,0x17,local_158);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc08,(char (*) [1])in_stack_fffffffffffffc00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_194 + 4),
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
               ,0x6d);
    local_194._0_4_ = 0;
    in_stack_fffffffffffffc08 = (lazy_ostream *)0x417703;
    in_stack_fffffffffffffc00 = (basic_cstring<const_char> *)local_194;
    pcVar2 = "scode";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_180,local_194 + 4,0x17,1,2,local_b4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x148c49);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  check_float_vectors(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd74)
  ;
  local_1a0 = (float *)std::begin<std::vector<float,std::allocator<float>>>
                                 ((vector<float,_std::allocator<float>_> *)pcVar2);
  local_1a8 = (float *)std::end<std::vector<float,std::allocator<float>>>
                                 ((vector<float,_std::allocator<float>_> *)pcVar2);
  pdf_last_01._M_current._7_1_ = in_stack_fffffffffffffc1f;
  pdf_last_01._M_current._0_7_ = in_stack_fffffffffffffc18;
  local_b4[0] = exploration::
                sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                          ((uint64_t)in_stack_fffffffffffffc10,in_stack_fffffffffffffc20,pdf_last_01
                           ,(uint32_t *)in_stack_fffffffffffffc08);
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffc00);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,&local_1b8,0x1b,local_1c8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc08,(char (*) [1])in_stack_fffffffffffffc00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_204 + 4),
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
               ,0x6d);
    local_204._0_4_ = 0;
    in_stack_fffffffffffffc08 = (lazy_ostream *)0x417703;
    in_stack_fffffffffffffc00 = (basic_cstring<const_char> *)local_204;
    pcVar2 = "scode";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1f0,local_204 + 4,0x1b,1,2,local_b4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x148e1e);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  check_float_vectors(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd74)
  ;
  local_210 = (float *)std::begin<std::vector<float,std::allocator<float>>>
                                 ((vector<float,_std::allocator<float>_> *)pcVar2);
  local_218 = (float *)std::end<std::vector<float,std::allocator<float>>>
                                 ((vector<float,_std::allocator<float>_> *)pcVar2);
  pdf_last_02._M_current._7_1_ = in_stack_fffffffffffffc1f;
  pdf_last_02._M_current._0_7_ = in_stack_fffffffffffffc18;
  local_b4[0] = exploration::
                sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                          ((uint64_t)in_stack_fffffffffffffc10,in_stack_fffffffffffffc20,pdf_last_02
                           ,(uint32_t *)in_stack_fffffffffffffc08);
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_228,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffc00);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,&local_228,0x1f,local_238);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc08,(char (*) [1])in_stack_fffffffffffffc00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_274 + 4),
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
               ,0x6d);
    local_274._0_4_ = 0;
    in_stack_fffffffffffffc08 = (lazy_ostream *)0x417703;
    in_stack_fffffffffffffc00 = (basic_cstring<const_char> *)local_274;
    pcVar2 = "scode";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_260,local_274 + 4,0x1f,1,2,local_b4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x148fd5);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  check_float_vectors(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd74)
  ;
  lhs = std::begin<std::vector<float,std::allocator<float>>>
                  ((vector<float,_std::allocator<float>_> *)pcVar2);
  rhs = std::end<std::vector<float,std::allocator<float>>>
                  ((vector<float,_std::allocator<float>_> *)pcVar2);
  pdf_last_03._M_current._7_1_ = in_stack_fffffffffffffc1f;
  pdf_last_03._M_current._0_7_ = in_stack_fffffffffffffc18;
  local_b4[0] = exploration::
                sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                          ((uint64_t)in_stack_fffffffffffffc10,in_stack_fffffffffffffc20,pdf_last_03
                           ,(uint32_t *)in_stack_fffffffffffffc08);
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_298,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffc00);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,local_298,0x23,local_2a8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc08,(char (*) [1])in_stack_fffffffffffffc00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_2e4 + 4),
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
               ,0x6d);
    local_2e4._0_4_ = 0;
    in_stack_fffffffffffffc08 = (lazy_ostream *)0x417703;
    in_stack_fffffffffffffc00 = (basic_cstring<const_char> *)local_2e4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_2d0,local_2e4 + 4,0x23,1,2,local_b4,"scode");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x149186);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  check_float_vectors((vector<float,_std::allocator<float>_> *)lhs._M_current,
                      (vector<float,_std::allocator<float>_> *)rhs._M_current,
                      in_stack_fffffffffffffd74);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffc10);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffc10);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(sample_after_nomalizing_basic) {
  std::vector<float> pdf = { 1.0f, 2.0f, 3.0f, 4.0f, 5.0f };
  const std::vector<float> expected = { 0.066666667f,	0.133333333f,	0.2f,	0.266666667f,	0.333333333f };
  uint32_t chosen_index;

  auto scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);

  scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);

  scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);

  scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);

  scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);
}